

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astDoWhileContinueWithNode_primitiveMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 4) {
    sysbvm_error_argumentCountMismatch(4,argumentCount);
  }
  sVar1 = sysbvm_macroContext_getSourcePosition(*arguments);
  sVar1 = sysbvm_astDoWhileContinueWithNode_create
                    (context,sVar1,arguments[1],arguments[2],arguments[3]);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDoWhileContinueWithNode_primitiveMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 4) sysbvm_error_argumentCountMismatch(4, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];
    sysbvm_tuple_t *bodyExpressionNode = &arguments[1];
    sysbvm_tuple_t *conditionNode = &arguments[2];
    sysbvm_tuple_t *continueExpressionNode = &arguments[3];

    sysbvm_tuple_t sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);

    return sysbvm_astDoWhileContinueWithNode_create(context, sourcePosition, *bodyExpressionNode, *conditionNode, *continueExpressionNode);
}